

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLDST2Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t in_ESI;
  void *unaff_retaddr;
  uint64_t in_stack_00000008;
  uint size;
  uint load;
  uint align;
  uint type;
  undefined4 local_3c;
  undefined4 local_4;
  
  uVar1 = fieldFromInstruction_4(in_ESI,6,2);
  if (uVar1 == 3) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    uVar1 = fieldFromInstruction_4(in_ESI,8,4);
    uVar2 = fieldFromInstruction_4(in_ESI,4,2);
    if ((uVar1 == 8) && (uVar2 == 3)) {
      local_4 = MCDisassembler_Fail;
    }
    else if ((uVar1 == 9) && (uVar2 == 3)) {
      local_4 = MCDisassembler_Fail;
    }
    else {
      uVar1 = fieldFromInstruction_4(in_ESI,0x15,1);
      if (uVar1 == 0) {
        local_3c = DecodeVSTInstruction(_align,load,in_stack_00000008,unaff_retaddr);
      }
      else {
        local_3c = DecodeVLDInstruction(_align,load,in_stack_00000008,unaff_retaddr);
      }
      local_4 = local_3c;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeVLDST2Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned type, align, load;
	unsigned size = fieldFromInstruction_4(Insn, 6, 2);
	if (size == 3) return MCDisassembler_Fail;

	type = fieldFromInstruction_4(Insn, 8, 4);
	align = fieldFromInstruction_4(Insn, 4, 2);
	if (type == 8 && align == 3) return MCDisassembler_Fail;
	if (type == 9 && align == 3) return MCDisassembler_Fail;

	load = fieldFromInstruction_4(Insn, 21, 1);
	return load ? DecodeVLDInstruction(Inst, Insn, Address, Decoder)
		: DecodeVSTInstruction(Inst, Insn, Address, Decoder);
}